

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O3

void pzshape::TPZShapePrism::ShapeInternal
               (int side,TPZVec<double> *x,int order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  long *plVar1;
  
  if (0xfffffff0 < side - 0x15U) {
    switch(side) {
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
      TPZShapeLinear::ShapeInternal(x,order,phi,dphi);
      return;
    case 0xf:
    case 0x13:
      TPZShapeTriang::ShapeInternal(x,order,phi,dphi);
      return;
    case 0x10:
    case 0x11:
    case 0x12:
      TPZShapeQuad::ShapeInternal(x,order,phi,dphi);
      return;
    case 0x14:
      ShapeInternal(x,order,phi,dphi);
      return;
    default:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Wrong side parameter side ",0x1a);
      plVar1 = (long *)std::ostream::operator<<(&std::cout,side);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapeprism.cpp"
                 ,0x2ca);
    }
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapeprism.cpp"
             ,0x29f);
}

Assistant:

void TPZShapePrism::ShapeInternal(int side, TPZVec<REAL> &x, int order,
                                      TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi){
        if (side < 6 || side > 20) {
            DebugStop();
        }
        
        switch (side) {
                
            case 6:
            case 7:
            case 8:
            case 9:
            case 10:
            case 11:
            case 12:
            case 13:
            case 14:
            {
                pzshape::TPZShapeLinear::ShapeInternal(x, order, phi, dphi);
            }
                break;
                
            case 15:
            case 19:
                
            {
            
                pzshape::TPZShapeTriang::ShapeInternal(x, order, phi, dphi);
            }
                break;
                
            case 16:
            case 17:
            case 18:
            {
                pzshape::TPZShapeQuad::ShapeInternal(x, order, phi, dphi);
            }
                break;

            case 20:
            {
                ShapeInternal(x, order, phi, dphi);
            }
                break;
            default:
                std::cout << "Wrong side parameter side " << side << std::endl;
                DebugStop();
                break;
        }
     
        
    }